

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::MaybeWarnUninitialized(cmMakefile *this,string *variable,char *sourceFilename)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream msg;
  string local_1b0;
  ostringstream local_190 [376];
  
  if ((this->GlobalGenerator->CMakeInstance->WarnUninitialized == true) &&
     (bVar1 = cmStateSnapshot::IsInitialized(&this->StateSnapshot,variable), !bVar1)) {
    if (this->CheckSystemVars == false) {
      if (sourceFilename == (char *)0x0) {
        return;
      }
      bVar1 = IsProjectFile(this,sourceFilename);
      if (!bVar1) {
        return;
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"uninitialized variable \'");
    poVar2 = std::operator<<(poVar2,(string *)variable);
    std::operator<<(poVar2,"\'");
    std::__cxx11::stringbuf::str();
    IssueMessage(this,AUTHOR_WARNING,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return;
}

Assistant:

cmake* cmMakefile::GetCMakeInstance() const
{
  return this->GlobalGenerator->GetCMakeInstance();
}